

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmaster.c
# Opt level: O2

void jinit_master_decompress(j_decompress_ptr cinfo)

{
  jpeg_decomp_master *pjVar1;
  jpeg_error_mgr *pjVar2;
  jpeg_decomp_master *pjVar3;
  jpeg_progress_mgr *pjVar4;
  boolean bVar5;
  void *__s;
  int iVar6;
  uint need_full_buffer;
  long lVar7;
  
  pjVar1 = cinfo->master;
  pjVar1->prepare_for_output_pass = prepare_for_output_pass;
  pjVar1->finish_output_pass = finish_output_pass;
  pjVar1->is_dummy_pass = 0;
  pjVar1->jinit_upsampler_no_alloc = 0;
  jpeg_calc_output_dimensions(cinfo);
  need_full_buffer = 1;
  __s = (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x580);
  cinfo->sample_range_limit = (JSAMPLE *)((long)__s + 0x100);
  memset(__s,0,0x100);
  for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
    ((JSAMPLE *)((long)__s + 0x100))[lVar7] = (JSAMPLE)lVar7;
  }
  for (lVar7 = 0; lVar7 != 0x180; lVar7 = lVar7 + 1) {
    *(undefined1 *)((long)__s + lVar7 + 0x200) = 0xff;
  }
  memset((void *)((long)__s + 0x380),0,0x180);
  memcpy((void *)((long)__s + 0x500),cinfo->sample_range_limit,0x80);
  if ((long)cinfo->out_color_components * (ulong)cinfo->output_width >> 0x20 != 0) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x46;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  *(undefined4 *)&pjVar1[1].prepare_for_output_pass = 0;
  bVar5 = use_merged_upsample(cinfo);
  *(boolean *)((long)&pjVar1[1].prepare_for_output_pass + 4) = bVar5;
  pjVar1[1].finish_output_pass = (_func_void_j_decompress_ptr *)0x0;
  pjVar1[1].is_dummy_pass = 0;
  pjVar1[1].first_iMCU_col = 0;
  if (cinfo->quantize_colors == 0) {
    cinfo->enable_1pass_quant = 0;
    cinfo->enable_external_quant = 0;
    cinfo->enable_2pass_quant = 0;
  }
  else {
    if (cinfo->buffered_image == 0) {
      cinfo->enable_1pass_quant = 0;
      cinfo->enable_external_quant = 0;
      cinfo->enable_2pass_quant = 0;
    }
    if (cinfo->raw_data_out != 0) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x2f;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    if (cinfo->out_color_components == 3) {
      if (cinfo->colormap == (JSAMPARRAY)0x0) {
        if (cinfo->two_pass_quantize == 0) {
          cinfo->enable_1pass_quant = 1;
        }
        else {
          cinfo->enable_2pass_quant = 1;
        }
      }
      else {
        cinfo->enable_external_quant = 1;
      }
    }
    else {
      cinfo->enable_1pass_quant = 1;
      cinfo->enable_external_quant = 0;
      cinfo->enable_2pass_quant = 0;
      cinfo->colormap = (JSAMPARRAY)0x0;
    }
    if (cinfo->enable_1pass_quant != 0) {
      jinit_1pass_quantizer(cinfo);
      pjVar1[1].finish_output_pass = (_func_void_j_decompress_ptr *)cinfo->cquantize;
    }
    if ((cinfo->enable_2pass_quant != 0) || (cinfo->enable_external_quant != 0)) {
      jinit_2pass_quantizer(cinfo);
      *(jpeg_color_quantizer **)&pjVar1[1].is_dummy_pass = cinfo->cquantize;
    }
  }
  if (cinfo->raw_data_out == 0) {
    if (*(int *)((long)&pjVar1[1].prepare_for_output_pass + 4) == 0) {
      jinit_color_deconverter(cinfo);
      jinit_upsampler(cinfo);
    }
    else {
      jinit_merged_upsampler(cinfo);
    }
    jinit_d_post_controller(cinfo,cinfo->enable_2pass_quant);
  }
  jinit_inverse_dct(cinfo);
  if (cinfo->arith_code == 0) {
    if (cinfo->progressive_mode == 0) {
      jinit_huff_decoder(cinfo);
    }
    else {
      jinit_phuff_decoder(cinfo);
    }
  }
  else {
    jinit_arith_decoder(cinfo);
  }
  if (cinfo->inputctl->has_multiple_scans == 0) {
    need_full_buffer = (uint)(cinfo->buffered_image != 0);
  }
  jinit_d_coef_controller(cinfo,need_full_buffer);
  if (cinfo->raw_data_out == 0) {
    jinit_d_main_controller(cinfo,0);
  }
  (*cinfo->mem->realize_virt_arrays)((j_common_ptr)cinfo);
  (*cinfo->inputctl->start_input_pass)(cinfo);
  pjVar3 = cinfo->master;
  pjVar3->first_iMCU_col = 0;
  pjVar3->last_iMCU_col = cinfo->MCUs_per_row - 1;
  pjVar3->last_good_iMCU_row = 0;
  pjVar4 = cinfo->progress;
  if (((pjVar4 != (jpeg_progress_mgr *)0x0) && (cinfo->buffered_image == 0)) &&
     (cinfo->inputctl->has_multiple_scans != 0)) {
    iVar6 = cinfo->num_components * 3 + 2;
    if (cinfo->progressive_mode == 0) {
      iVar6 = cinfo->num_components;
    }
    pjVar4->pass_counter = 0;
    pjVar4->pass_limit = (long)iVar6 * (ulong)cinfo->total_iMCU_rows;
    pjVar4->completed_passes = 0;
    pjVar4->total_passes = 3 - (uint)(cinfo->enable_2pass_quant == 0);
    *(int *)&pjVar1[1].prepare_for_output_pass = *(int *)&pjVar1[1].prepare_for_output_pass + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_master_decompress(j_decompress_ptr cinfo)
{
  my_master_ptr master = (my_master_ptr)cinfo->master;

  master->pub.prepare_for_output_pass = prepare_for_output_pass;
  master->pub.finish_output_pass = finish_output_pass;

  master->pub.is_dummy_pass = FALSE;
  master->pub.jinit_upsampler_no_alloc = FALSE;

  master_selection(cinfo);
}